

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCall(Parser *this)

{
  Token *pTVar1;
  CompileContext *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  Token name;
  Token paren;
  string local_50;
  
  parsePrecPrimary(this);
  pTVar1 = &in_RSI->m_previous;
  while( true ) {
    while( true ) {
      bVar4 = consume(in_RSI,LEFT_PAREN);
      if (bVar4) break;
      bVar4 = consume(in_RSI,DOT);
      if (!bVar4) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      Token::Token(&paren,pTVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"Expected property name after \'.\'.",
                 (allocator<char> *)local_d0[0]._M_local_buf);
      expect(in_RSI,IDENTIFIER,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      Token::Token(&name,pTVar1);
      std::
      make_unique<enact::FieldExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,enact::Token>
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
                 &local_d0[0]._M_allocated_capacity,(Token *)this,&name);
      uVar3 = local_d0[0]._M_allocated_capacity;
      local_d0[0]._M_allocated_capacity = (CompileContext *)0x0;
      pCVar2 = this->m_context;
      this->m_context = (CompileContext *)uVar3;
      if (pCVar2 != (CompileContext *)0x0) {
        (**(code **)((pCVar2->m_source)._M_dataplus._M_p + 8))();
        if ((CompileContext *)local_d0[0]._0_8_ != (CompileContext *)0x0) {
          (**(code **)(*(long *)local_d0[0]._0_8_ + 8))();
        }
      }
      std::__cxx11::string::~string((string *)&name.lexeme);
      std::__cxx11::string::~string((string *)&paren.lexeme);
    }
    args.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    args.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((in_RSI->m_current).type != RIGHT_PAREN) {
      do {
        parseExpr((Parser *)&paren);
        std::
        vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
        ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                  ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                    *)&args,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&paren);
        if (paren._0_8_ != 0) {
          (**(code **)(*(long *)paren._0_8_ + 8))();
        }
        bVar4 = consume(in_RSI,COMMA);
      } while (bVar4);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&paren,"Expected \')\' after function call arguments.",
               (allocator<char> *)&name);
    expect(in_RSI,RIGHT_PAREN,(string *)&paren);
    std::__cxx11::string::~string((string *)&paren);
    Token::Token(&paren,pTVar1);
    if (0x7f8 < (ulong)((long)args.
                              super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)args.
                             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) break;
    std::
    make_unique<enact::CallExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&name,
               (vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                *)this,(Token *)&args);
    uVar3 = name._0_8_;
    name.type = LEFT_PAREN;
    name._4_4_ = 0;
    pCVar2 = this->m_context;
    this->m_context = (CompileContext *)uVar3;
    if (pCVar2 != (CompileContext *)0x0) {
      (**(code **)((pCVar2->m_source)._M_dataplus._M_p + 8))();
      if (name._0_8_ != 0) {
        (**(code **)(*(long *)name._0_8_ + 8))();
      }
    }
    std::__cxx11::string::~string((string *)&paren.lexeme);
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector(&args);
  }
  __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_50,
             (long)args.
                   super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)args.
                   super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "Too many arguments in function call; ",&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 " were provided, max is 255.");
  errorAt(__return_storage_ptr__,in_RSI,&paren,(string *)&name);
  __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCall() {
        std::unique_ptr<Expr> expr = parsePrecPrimary();

        while (true) {
            if (consume(TokenType::LEFT_PAREN)) {
                std::vector<std::unique_ptr<Expr>> args;
                if (!check(TokenType::RIGHT_PAREN)) {
                    do {
                        args.push_back(parseExpr());
                    } while (consume(TokenType::COMMA));
                }

                expect(TokenType::RIGHT_PAREN, "Expected ')' after function call arguments.");
                Token paren = m_previous;

                if (args.size() > 255) {
                    throw errorAt(paren,
                            "Too many arguments in function call; " +
                            std::to_string(args.size()) +
                            " were provided, max is 255.");
                }

                expr = std::make_unique<CallExpr>(std::move(expr), std::move(args), std::move(paren));
            } else if (consume(TokenType::DOT)) {
                Token dot = m_previous;

                expect(TokenType::IDENTIFIER, "Expected property name after '.'.");
                Token name = m_previous;

                expr = std::make_unique<FieldExpr>(std::move(expr), std::move(name), std::move(dot));
            } else {
                break;
            }
        }

        return expr;
    }